

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageStoreCase::iterate(ImageStoreCase *this)

{
  TextureType TVar1;
  Vector<int,_3> *pVVar2;
  GLenum target;
  undefined8 log_00;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  GLSLVersion version;
  GLuint GVar9;
  GLuint GVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  RenderContext *context;
  undefined4 extraout_var;
  MessageBuilder *pMVar15;
  char *pcVar16;
  ProgramSources *sources;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  uint uVar17;
  ulong uVar18;
  RenderContext *renderContext;
  TextureFormat *format;
  char *local_da0;
  TextureType local_d90;
  undefined4 local_d20;
  float local_d18;
  float local_d10;
  float local_cf0;
  Vector<int,_2> local_cd8;
  ImageLayerComparer local_cd0;
  undefined1 local_cb5;
  undefined1 local_cb4 [7];
  bool compareOk;
  Vector<float,_4> local_ca4;
  Vector<float,_4> local_c94;
  undefined1 local_c84 [8];
  IVec4 color;
  int x;
  int y;
  int z;
  LayeredImage reference;
  int isIntegerFormat;
  int local_bd8;
  int local_bd4;
  int layerNdx;
  UniformAccessLogger uniforms;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  byte local_b59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b58;
  byte local_b31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b10;
  string local_af0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_950;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  ShaderSource local_8f0;
  ProgramSources local_8c8;
  undefined1 local_7f8 [8];
  ShaderProgram program;
  undefined1 local_720 [8];
  string glslVersionDeclaration;
  string local_6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  byte local_6b2;
  allocator<char> local_6b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  byte local_689;
  string local_688;
  byte local_662;
  allocator<char> local_661;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_640;
  undefined1 local_620 [8];
  string colorExpr;
  string local_5f8;
  int local_5d4;
  string local_5d0;
  int local_5ac;
  string local_5a8;
  int local_584;
  string local_580;
  allocator<char> local_559;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  undefined1 local_438 [8];
  string colorBaseExpr;
  undefined1 local_410 [6];
  bool isIntFormat;
  bool isUintFormat;
  string shaderImageTypeStr;
  undefined1 local_3e8 [4];
  TextureType shaderImageType;
  string shaderImageFormatStr;
  MessageBuilder local_3c0;
  deUint32 local_23c;
  MessageBuilder local_238;
  undefined1 local_b8 [8];
  Texture texture;
  Buffer textureBuf;
  float local_80;
  float storeColorBias;
  float storeColorScale;
  int maxImageDimension;
  int numSlicesOrFaces;
  Vector<int,_3> *local_68;
  IVec3 *imageSize;
  deUint32 textureTargetGL;
  TextureFormat local_50;
  deUint32 local_44;
  undefined1 local_40 [4];
  deUint32 internalFormatGL;
  CallLogWrapper glLog;
  TestLog *log;
  RenderContext *renderCtx;
  ImageStoreCase *this_local;
  
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glLog._16_8_ = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  iVar4 = (*context->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_40,(Functions *)CONCAT44(extraout_var,iVar4),
             (TestLog *)glLog._16_8_);
  local_50 = this->m_format;
  local_44 = glu::getInternalFormat(local_50);
  imageSize._0_4_ = Functional::getGLTextureTarget(this->m_textureType);
  defaultImageSize((Functional *)&maxImageDimension,this->m_textureType);
  local_68 = (Vector<int,_3> *)&maxImageDimension;
  if (this->m_textureType == TEXTURETYPE_CUBE) {
    local_cf0 = 8.40779e-45;
  }
  else {
    local_cf0 = (float)tcu::Vector<int,_3>::z(local_68);
  }
  storeColorScale = local_cf0;
  iVar4 = tcu::Vector<int,_3>::x(local_68);
  iVar5 = tcu::Vector<int,_3>::y(local_68);
  iVar6 = tcu::Vector<int,_3>::z(local_68);
  iVar5 = de::max<int>(iVar5,iVar6);
  storeColorBias = (float)de::max<int>(iVar4,iVar5);
  bVar3 = isFormatTypeUnorm((this->m_format).type);
  if (bVar3) {
    local_d10 = 1.0 / (float)((int)storeColorBias + -1);
  }
  else {
    bVar3 = isFormatTypeSnorm((this->m_format).type);
    if (bVar3) {
      local_d18 = 2.0 / (float)((int)storeColorBias + -1);
    }
    else {
      local_d18 = 1.0;
    }
    local_d10 = local_d18;
  }
  local_80 = local_d10;
  bVar3 = isFormatTypeSnorm((this->m_format).type);
  local_d20 = 0xbf800000;
  if (!bVar3) {
    local_d20 = 0;
  }
  textureBuf.super_ObjectWrapper._20_4_ = local_d20;
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&texture.super_ObjectWrapper.m_object,context
            );
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_b8,context);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_40,true);
  tcu::TestLog::operator<<
            (&local_238,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar15 = tcu::MessageBuilder::operator<<(&local_238,(char (*) [28])"// Created a texture (name ")
  ;
  local_23c = glu::ObjectWrapper::operator*((ObjectWrapper *)local_b8);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,&local_23c);
  pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2a85ff4);
  tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_238);
  if (this->m_textureType == TEXTURETYPE_BUFFER) {
    tcu::TestLog::operator<<
              (&local_3c0,(TestLog *)glLog._16_8_,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (&local_3c0,(char (*) [43])"// Created a buffer for the texture (name ");
    shaderImageFormatStr.field_2._12_4_ =
         glu::ObjectWrapper::operator*((ObjectWrapper *)&texture.super_ObjectWrapper.m_object);
    pMVar15 = tcu::MessageBuilder::operator<<
                        (pMVar15,(uint *)(shaderImageFormatStr.field_2._M_local_buf + 0xc));
    pMVar15 = tcu::MessageBuilder::operator<<(pMVar15,(char (*) [2])0x2a85ff4);
    tcu::MessageBuilder::operator<<(pMVar15,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_3c0);
  }
  glu::CallLogWrapper::glActiveTexture((CallLogWrapper *)local_40,0x84c0);
  target = (deUint32)imageSize;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_b8);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)local_40,target,dVar7);
  setTexParameteri((CallLogWrapper *)local_40,(deUint32)imageSize);
  dVar7 = local_44;
  pVVar2 = local_68;
  TVar1 = this->m_textureType;
  dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture.super_ObjectWrapper.m_object);
  setTextureStorage((CallLogWrapper *)local_40,TVar1,dVar7,pVVar2,dVar8);
  getShaderImageFormatQualifier_abi_cxx11_((string *)local_3e8,(Functional *)&this->m_format,format)
  ;
  if ((this->m_singleLayerBind & 1U) == 0) {
    local_d90 = this->m_textureType;
  }
  else {
    local_d90 = textureLayerType(this->m_textureType);
  }
  uVar18 = (ulong)local_d90;
  shaderImageTypeStr.field_2._12_4_ = local_d90;
  getShaderImageType_abi_cxx11_
            ((string *)local_410,(Functional *)(ulong)(this->m_format).type,local_d90,local_d90);
  colorBaseExpr.field_2._M_local_buf[0xf] = isFormatTypeUnsignedInteger((this->m_format).type);
  renderContext =
       (RenderContext *)CONCAT71((int7)(uVar18 >> 8),colorBaseExpr.field_2._M_local_buf[0xf]);
  colorBaseExpr.field_2._M_local_buf[0xe] = isFormatTypeSignedInteger((this->m_format).type);
  if ((colorBaseExpr.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_da0 = "";
    renderContext = (RenderContext *)0x2befccc;
    if ((bool)colorBaseExpr.field_2._M_local_buf[0xe]) {
      local_da0 = "i";
    }
  }
  else {
    local_da0 = "u";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,local_da0,&local_559);
  std::operator+(&local_538,&local_558,"vec4(gx^gy^gz, (");
  local_584 = tcu::Vector<int,_3>::x(local_68);
  local_584 = local_584 + -1;
  de::toString<int>(&local_580,&local_584);
  std::operator+(&local_518,&local_538,&local_580);
  std::operator+(&local_4f8,&local_518,"-gx)^gy^gz, gx^(");
  local_5ac = tcu::Vector<int,_3>::y(local_68);
  local_5ac = local_5ac + -1;
  de::toString<int>(&local_5a8,&local_5ac);
  std::operator+(&local_4d8,&local_4f8,&local_5a8);
  std::operator+(&local_4b8,&local_4d8,"-gy)^gz, (");
  local_5d4 = tcu::Vector<int,_3>::x(local_68);
  local_5d4 = local_5d4 + -1;
  de::toString<int>(&local_5d0,&local_5d4);
  std::operator+(&local_498,&local_4b8,&local_5d0);
  std::operator+(&local_478,&local_498,"-gx)^(");
  iVar4 = tcu::Vector<int,_3>::y(local_68);
  colorExpr.field_2._12_4_ = iVar4 + -1;
  de::toString<int>(&local_5f8,(int *)(colorExpr.field_2._M_local_buf + 0xc));
  std::operator+(&local_458,&local_478,&local_5f8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 &local_458,"-gy)^gz)");
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  local_662 = 0;
  local_689 = 0;
  if ((local_80 != 1.0) || (NAN(local_80))) {
    de::toString<float>(&local_688,&local_80);
    local_689 = 1;
    std::operator+(&local_660,"*",&local_688);
  }
  else {
    std::allocator<char>::allocator();
    local_662 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_660,"",&local_661);
  }
  std::operator+(&local_640,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
                 &local_660);
  local_6b2 = 0;
  glslVersionDeclaration.field_2._M_local_buf[0xf] = '\0';
  glslVersionDeclaration.field_2._M_local_buf[0xe] = '\0';
  if (((float)textureBuf.super_ObjectWrapper._20_4_ != 0.0) ||
     (NAN((float)textureBuf.super_ObjectWrapper._20_4_))) {
    de::toString<float>(&local_6f8,(float *)&textureBuf.super_ObjectWrapper.field_0x14);
    glslVersionDeclaration.field_2._M_local_buf[0xf] = '\x01';
    std::operator+(&local_6d8," + float(",&local_6f8);
    glslVersionDeclaration.field_2._M_local_buf[0xe] = '\x01';
    std::operator+(&local_6b0,&local_6d8,")");
  }
  else {
    std::allocator<char>::allocator();
    local_6b2 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"",&local_6b1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620,
                 &local_640,&local_6b0);
  std::__cxx11::string::~string((string *)&local_6b0);
  if ((glslVersionDeclaration.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_6d8);
  }
  if ((glslVersionDeclaration.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_6f8);
  }
  if ((local_6b2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_6b1);
  }
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_660);
  if ((local_689 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_688);
  }
  if ((local_662 & 1) != 0) {
    std::allocator<char>::~allocator(&local_661);
  }
  program.m_program.m_info.linkTimeUs._4_4_ = (*context->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion((ContextType)program.m_program.m_info.linkTimeUs._4_4_);
  pcVar16 = glu::getGLSLVersionDeclaration(version);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_720,pcVar16,
             (allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&program.m_program.m_info.linkTimeUs + 3));
  glu::ProgramSources::ProgramSources(&local_8c8);
  std::operator+(&local_ad0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720,"\n"
                );
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_af0,(Functional *)(ulong)(uint)shaderImageTypeStr.field_2._12_4_,
             (TextureType)context,renderContext);
  std::operator+(&local_ab0,&local_ad0,&local_af0);
  std::operator+(&local_a90,&local_ab0,"\nprecision highp ");
  std::operator+(&local_a70,&local_a90,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  std::operator+(&local_a50,&local_a70,
                 ";\n\nlayout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\nlayout (")
  ;
  std::operator+(&local_a30,&local_a50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8);
  std::operator+(&local_a10,&local_a30,", binding=0) writeonly uniform ");
  std::operator+(&local_9f0,&local_a10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  std::operator+(&local_9d0,&local_9f0," u_image;\n");
  pcVar16 = "";
  if ((this->m_singleLayerBind & 1U) != 0) {
    pcVar16 = "uniform int u_layerNdx;\n";
  }
  std::operator+(&local_9b0,&local_9d0,pcVar16);
  std::operator+(&local_990,&local_9b0,
                 "\nvoid main (void)\n{\n\tint gx = int(gl_GlobalInvocationID.x);\n\tint gy = int(gl_GlobalInvocationID.y);\n\tint gz = "
                );
  pcVar16 = "int(gl_GlobalInvocationID.z)";
  if ((this->m_singleLayerBind & 1U) != 0) {
    pcVar16 = "u_layerNdx";
  }
  std::operator+(&local_970,&local_990,pcVar16);
  std::operator+(&local_950,&local_970,";\n");
  local_b31 = 0;
  local_b59 = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
  uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  if (shaderImageTypeStr.field_2._12_4_ == 7) {
    std::operator+(&local_b30,"\timageStore(u_image, gx, ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
    local_b31 = 1;
    std::operator+(&local_b10,&local_b30,");\n");
  }
  else if (shaderImageTypeStr.field_2._12_4_ == 0) {
    std::operator+(&local_b58,"\timageStore(u_image, ivec2(gx, gy), ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
    local_b59 = 1;
    std::operator+(&local_b10,&local_b58,");\n");
  }
  else if (((shaderImageTypeStr.field_2._12_4_ == 3) || (shaderImageTypeStr.field_2._12_4_ == 1)) ||
          (shaderImageTypeStr.field_2._12_4_ == 2)) {
    std::operator+(&local_b80,"\timageStore(u_image, ivec3(gx, gy, gz), ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620);
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
    std::operator+(&local_b10,&local_b80,");\n");
  }
  else {
    std::allocator<char>::allocator();
    uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b10,(char *)0x0,
               (allocator<char> *)
               ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
               + 6));
  }
  std::operator+(&local_930,&local_950,&local_b10);
  std::operator+(&local_910,&local_930,"}\n");
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_8f0,&local_910);
  sources = glu::ProgramSources::operator<<(&local_8c8,&local_8f0);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_7f8,context,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_b10);
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) != 0)
  {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count
               + 6));
  }
  if ((uniforms.m_uniformLocations._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0)
  {
    std::__cxx11::string::~string((string *)&local_b80);
  }
  if ((local_b59 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b58);
  }
  if ((local_b31 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_b30);
  }
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_a90);
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_af0);
  std::__cxx11::string::~string((string *)&local_ad0);
  glu::ProgramSources::~ProgramSources(&local_8c8);
  iVar4 = (*context->_vptr_RenderContext[3])();
  log_00 = glLog._16_8_;
  dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_7f8);
  UniformAccessLogger::UniformAccessLogger
            ((UniformAccessLogger *)&layerNdx,(Functions *)CONCAT44(extraout_var_00,iVar4),
             (TestLog *)log_00,dVar7);
  glu::operator<<((TestLog *)glLog._16_8_,(ShaderProgram *)local_7f8);
  bVar3 = glu::ShaderProgram::isOk((ShaderProgram *)local_7f8);
  if (bVar3) {
    dVar7 = glu::ShaderProgram::getProgram((ShaderProgram *)local_7f8);
    glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_40,dVar7);
    if ((this->m_singleLayerBind & 1U) == 0) {
      dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_b8);
      glu::CallLogWrapper::glBindImageTexture
                ((CallLogWrapper *)local_40,0,dVar7,0,'\x01',0,0x88b9,local_44);
      iVar4 = (*context->_vptr_RenderContext[3])();
      dVar7 = (**(code **)(CONCAT44(extraout_var_03,iVar4) + 0x800))();
      glu::checkError(dVar7,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x4d4);
      GVar9 = tcu::Vector<int,_3>::x(local_68);
      GVar10 = tcu::Vector<int,_3>::y(local_68);
      glu::CallLogWrapper::glDispatchCompute
                ((CallLogWrapper *)local_40,GVar9,GVar10,(GLuint)storeColorScale);
      iVar4 = (*context->_vptr_RenderContext[3])();
      dVar7 = (**(code **)(CONCAT44(extraout_var_04,iVar4) + 0x800))();
      glu::checkError(dVar7,"glDispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x4d7);
    }
    else {
      for (local_bd8 = 0; local_bd8 < (int)storeColorScale; local_bd8 = local_bd8 + 1) {
        if (0 < local_bd8) {
          glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)local_40,0x20);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&isIntegerFormat,"u_layerNdx",
                   (allocator<char> *)((long)&reference.m_tex2DArray.m_state + 7));
        UniformAccessLogger::assign1i
                  ((UniformAccessLogger *)&layerNdx,(string *)&isIntegerFormat,local_bd8);
        std::__cxx11::string::~string((string *)&isIntegerFormat);
        std::allocator<char>::~allocator
                  ((allocator<char> *)((long)&reference.m_tex2DArray.m_state + 7));
        dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_b8);
        glu::CallLogWrapper::glBindImageTexture
                  ((CallLogWrapper *)local_40,0,dVar7,0,'\0',local_bd8,0x88b9,local_44);
        iVar4 = (*context->_vptr_RenderContext[3])();
        dVar7 = (**(code **)(CONCAT44(extraout_var_01,iVar4) + 0x800))();
        glu::checkError(dVar7,"glBindImageTexture",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x4cb);
        GVar9 = tcu::Vector<int,_3>::x(local_68);
        GVar10 = tcu::Vector<int,_3>::y(local_68);
        glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)local_40,GVar9,GVar10,1);
        iVar4 = (*context->_vptr_RenderContext[3])();
        dVar7 = (**(code **)(CONCAT44(extraout_var_02,iVar4) + 0x800))();
        glu::checkError(dVar7,"glDispatchCompute",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                        ,0x4ce);
      }
    }
    local_bd4 = 0;
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Program compilation failed");
    this_local._4_4_ = STOP;
    local_bd4 = 1;
  }
  UniformAccessLogger::~UniformAccessLogger((UniformAccessLogger *)&layerNdx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_7f8);
  std::__cxx11::string::~string((string *)local_720);
  std::__cxx11::string::~string((string *)local_620);
  std::__cxx11::string::~string((string *)local_438);
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)local_3e8);
  if (local_bd4 == 0) {
    bVar3 = isFormatTypeInteger((this->m_format).type);
    reference.m_tex2DArray.m_state._0_4_ = (uint)bVar3;
    TVar1 = this->m_textureType;
    iVar4 = tcu::Vector<int,_3>::x(local_68);
    iVar5 = tcu::Vector<int,_3>::y(local_68);
    iVar6 = tcu::Vector<int,_3>::z(local_68);
    LayeredImage::LayeredImage((LayeredImage *)&y,TVar1,&this->m_format,iVar4,iVar5,iVar6);
    for (x = 0; x < (int)storeColorScale; x = x + 1) {
      for (color.m_data[3] = 0; iVar4 = color.m_data[3], iVar5 = tcu::Vector<int,_3>::y(local_68),
          iVar4 < iVar5; color.m_data[3] = color.m_data[3] + 1) {
        for (color.m_data[2] = 0; iVar4 = color.m_data[2], iVar5 = tcu::Vector<int,_3>::x(local_68),
            iVar4 < iVar5; color.m_data[2] = color.m_data[2] + 1) {
          uVar11 = color.m_data[2] ^ color.m_data[3];
          iVar5 = tcu::Vector<int,_3>::x(local_68);
          iVar4 = color.m_data[2];
          uVar12 = ~color.m_data[2] + iVar5 ^ color.m_data[3];
          iVar5 = tcu::Vector<int,_3>::y(local_68);
          uVar17 = ~color.m_data[3];
          iVar6 = tcu::Vector<int,_3>::x(local_68);
          uVar13 = ~color.m_data[2];
          iVar14 = tcu::Vector<int,_3>::y(local_68);
          tcu::Vector<int,_4>::Vector
                    ((Vector<int,_4> *)local_c84,uVar11 ^ x,uVar12 ^ x,iVar4 ^ uVar17 + iVar5 ^ x,
                     uVar13 + iVar6 ^ ~color.m_data[3] + iVar14 ^ x);
          iVar5 = color.m_data[3];
          iVar4 = color.m_data[2];
          if ((uint)reference.m_tex2DArray.m_state == 0) {
            tcu::Vector<int,_4>::asFloat((Vector<int,_4> *)local_cb4);
            tcu::operator*((tcu *)&local_ca4,(Vector<float,_4> *)local_cb4,local_80);
            tcu::operator+((tcu *)&local_c94,&local_ca4,(float)textureBuf.super_ObjectWrapper._20_4_
                          );
            Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                      ((LayeredImage *)&y,iVar4,iVar5,x,&local_c94);
          }
          else {
            Functional::(anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                      ((LayeredImage *)&y,color.m_data[2],color.m_data[3],x,
                       (Vector<int,_4> *)local_c84);
          }
        }
      }
    }
    dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_b8);
    dVar8 = glu::ObjectWrapper::operator*((ObjectWrapper *)&texture.super_ObjectWrapper.m_object);
    pVVar2 = local_68;
    TVar1 = this->m_textureType;
    tcu::Vector<int,_2>::Vector(&local_cd8,0);
    ImageLayerComparer::ImageLayerComparer(&local_cd0,(LayeredImage *)&y,&local_cd8);
    bVar3 = readTextureAndVerify
                      (context,(CallLogWrapper *)local_40,dVar7,dVar8,TVar1,&this->m_format,pVVar2,
                       &local_cd0.super_ImageLayerVerifier);
    ImageLayerComparer::~ImageLayerComparer(&local_cd0);
    pcVar16 = "Image comparison failed";
    if (bVar3) {
      pcVar16 = "Pass";
    }
    local_cb5 = bVar3;
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               (byte)~bVar3 & QP_TEST_RESULT_FAIL,pcVar16);
    this_local._4_4_ = STOP;
    local_bd4 = 1;
    LayeredImage::~LayeredImage((LayeredImage *)&y);
  }
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)local_b8);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)1> *)&texture.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_40);
  return this_local._4_4_;
}

Assistant:

ImageStoreCase::IterateResult ImageStoreCase::iterate (void)
{
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	TestLog&					log						(m_testCtx.getLog());
	glu::CallLogWrapper			glLog					(renderCtx.getFunctions(), log);
	const deUint32				internalFormatGL		= glu::getInternalFormat(m_format);
	const deUint32				textureTargetGL			= getGLTextureTarget(m_textureType);
	const IVec3&				imageSize				= defaultImageSize(m_textureType);
	const int					numSlicesOrFaces		= m_textureType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const int					maxImageDimension		= de::max(imageSize.x(), de::max(imageSize.y(), imageSize.z()));
	const float					storeColorScale			= isFormatTypeUnorm(m_format.type) ? 1.0f / (float)(maxImageDimension - 1)
														: isFormatTypeSnorm(m_format.type) ? 2.0f / (float)(maxImageDimension - 1)
														: 1.0f;
	const float					storeColorBias			= isFormatTypeSnorm(m_format.type) ? -1.0f : 0.0f;
	const glu::Buffer			textureBuf				(renderCtx); // \note Only really used if using buffer texture.
	const glu::Texture			texture					(renderCtx);

	glLog.enableLogging(true);

	// Setup texture.

	log << TestLog::Message << "// Created a texture (name " << *texture << ")" << TestLog::EndMessage;
	if (m_textureType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created a buffer for the texture (name " << *textureBuf << ")" << TestLog::EndMessage;

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *texture);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_textureType, internalFormatGL, imageSize, *textureBuf);

	// Perform image stores in compute shader.

	{
		// Generate compute shader.

		const string		shaderImageFormatStr	= getShaderImageFormatQualifier(m_format);
		const TextureType	shaderImageType			= m_singleLayerBind ? textureLayerType(m_textureType) : m_textureType;
		const string		shaderImageTypeStr		= getShaderImageType(m_format.type, shaderImageType);
		const bool			isUintFormat			= isFormatTypeUnsignedInteger(m_format.type);
		const bool			isIntFormat				= isFormatTypeSignedInteger(m_format.type);
		const string		colorBaseExpr			= string(isUintFormat ? "u" : isIntFormat ? "i" : "") + "vec4(gx^gy^gz, "
																												 "(" + toString(imageSize.x()-1) + "-gx)^gy^gz, "
																												 "gx^(" + toString(imageSize.y()-1) + "-gy)^gz, "
																												 "(" + toString(imageSize.x()-1) + "-gx)^(" + toString(imageSize.y()-1) + "-gy)^gz)";
		const string		colorExpr				= colorBaseExpr + (storeColorScale == 1.0f ? "" : "*" + toString(storeColorScale))
																	+ (storeColorBias == 0.0f ? "" : " + float(" + toString(storeColorBias) + ")");
		const std::string	glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(shaderImageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) writeonly uniform " + shaderImageTypeStr + " u_image;\n"
														+ (m_singleLayerBind ? "uniform int u_layerNdx;\n" : "") +
														"\n"
														"void main (void)\n"
														"{\n"
														"	int gx = int(gl_GlobalInvocationID.x);\n"
														"	int gy = int(gl_GlobalInvocationID.y);\n"
														"	int gz = " + (m_singleLayerBind ? "u_layerNdx" : "int(gl_GlobalInvocationID.z)") + ";\n"
														+ (shaderImageType == TEXTURETYPE_BUFFER ?
															"	imageStore(u_image, gx, " + colorExpr + ");\n"
														 : shaderImageType == TEXTURETYPE_2D ?
															"	imageStore(u_image, ivec2(gx, gy), " + colorExpr + ");\n"
														 : shaderImageType == TEXTURETYPE_3D || shaderImageType == TEXTURETYPE_CUBE || shaderImageType == TEXTURETYPE_2D_ARRAY ?
															"	imageStore(u_image, ivec3(gx, gy, gz), " + colorExpr + ");\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		if (m_singleLayerBind)
		{
			for (int layerNdx = 0; layerNdx < numSlicesOrFaces; layerNdx++)
			{
				if (layerNdx > 0)
					glLog.glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

				uniforms.assign1i("u_layerNdx", layerNdx);

				glLog.glBindImageTexture(0, *texture, 0, GL_FALSE, layerNdx, GL_WRITE_ONLY, internalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glDispatchCompute(imageSize.x(), imageSize.y(), 1);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
			}
		}
		else
		{
			glLog.glBindImageTexture(0, *texture, 0, GL_TRUE, 0, GL_WRITE_ONLY, internalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glDispatchCompute(imageSize.x(), imageSize.y(), numSlicesOrFaces);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
		}
	}

	// Create reference, read texture and compare to reference.
	{
		const int		isIntegerFormat		= isFormatTypeInteger(m_format.type);
		LayeredImage	reference			(m_textureType, m_format, imageSize.x(), imageSize.y(), imageSize.z());

		DE_ASSERT(!isIntegerFormat || (storeColorScale == 1.0f && storeColorBias == 0.0f));

		for (int z = 0; z < numSlicesOrFaces; z++)
		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x(); x++)
		{
			const IVec4 color(x^y^z, (imageSize.x()-1-x)^y^z, x^(imageSize.y()-1-y)^z, (imageSize.x()-1-x)^(imageSize.y()-1-y)^z);

			if (isIntegerFormat)
				reference.setPixel(x, y, z, color);
			else
				reference.setPixel(x, y, z, color.asFloat()*storeColorScale + storeColorBias);
		}

		const bool compareOk = readTextureAndVerify(renderCtx, glLog, *texture, *textureBuf, m_textureType, m_format, imageSize, ImageLayerComparer(reference));

		m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, compareOk ? "Pass" : "Image comparison failed");
		return STOP;
	}
}